

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_connect(connectdata *conn,_Bool *done)

{
  char *value;
  SASL *sasl;
  char cVar1;
  char *first;
  int iVar2;
  CURLcode CVar3;
  uint uVar4;
  char *pcVar5;
  size_t len;
  
  *done = false;
  CVar3 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 1800000;
  (conn->proto).ftpc.pp.statemach_act = imap_statemach_act;
  (conn->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  (conn->proto).imapc.preftype = 0xffffffff;
  sasl = &(conn->proto).imapc.sasl;
  Curl_sasl_init(sasl,&saslimap);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  (conn->proto).ftpc.dont_check = true;
  if (first != (char *)0x0) {
    cVar1 = *first;
    CVar3 = CURLE_OK;
    while (pcVar5 = first, cVar1 != '\0') {
      for (; (*pcVar5 != '\0' && (*pcVar5 != '=')); pcVar5 = pcVar5 + 1) {
      }
      value = pcVar5 + 1;
      len = 0xffffffffffffffff;
      for (; (*pcVar5 != '\0' && (*pcVar5 != ';')); pcVar5 = pcVar5 + 1) {
        len = len + 1;
      }
      iVar2 = Curl_strncasecompare(first,"AUTH=",5);
      if (iVar2 == 0) {
        CVar3 = CURLE_URL_MALFORMAT;
      }
      else {
        CVar3 = Curl_sasl_parse_url_auth_option(sasl,value,len);
      }
      if (CVar3 != CURLE_OK) break;
      first = pcVar5 + (*pcVar5 == ';');
      cVar1 = pcVar5[*pcVar5 == ';'];
    }
  }
  iVar2 = (conn->proto).sshc.orig_waitfor;
  uVar4 = (uint)(iVar2 != -0x21) * 3 - 1;
  if (iVar2 == 0) {
    uVar4 = 0;
  }
  (conn->proto).imapc.preftype = uVar4;
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  (conn->proto).imapc.state = IMAP_SERVERGREET;
  *(undefined2 *)((long)&conn->proto + 0xa0) = 0x2a;
  CVar3 = imap_multi_statemach(conn,done);
  return CVar3;
}

Assistant:

static CURLcode imap_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = imap_statemach_act;
  pp->endofresp = imap_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, &saslimap);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(conn, done);

  return result;
}